

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O1

bool __thiscall
google::protobuf::compiler::CommandLineInterface::WriteEditionDefaults
          (CommandLineInterface *this,DescriptorPool *pool)

{
  uint8_t *puVar1;
  ZeroCopyOutputStream **ppZVar2;
  bool bVar3;
  bool bVar4;
  int file_descriptor;
  Descriptor *extendee;
  int *piVar5;
  ostream *poVar6;
  char *pcVar7;
  size_t sVar8;
  uint8_t *ptr;
  ulong uVar9;
  Edition minimum_edition;
  string_view name;
  Span<const_google::protobuf::FieldDescriptor_*const> extensions_00;
  int size;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  extensions;
  void *data;
  CodedOutputStream coded_out;
  StatusOr<google::protobuf::FeatureSetDefaults> defaults;
  FileOutputStream out;
  Edition in_stack_fffffffffffffed8;
  uint local_11c;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  local_118;
  EpsCopyOutputStream *local_100;
  CodedOutputStream local_f8;
  anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::FeatureSetDefaults>_1 local_a8;
  MessageLite local_a0 [3];
  FileOutputStream local_68;
  
  name._M_str = "google.protobuf.FeatureSet";
  name._M_len = 0x1a;
  extendee = DescriptorPool::FindMessageTypeByName(pool,name);
  if (extendee == (Descriptor *)0x0) {
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(this->edition_defaults_out_name_)._M_dataplus._M_p,
                        (this->edition_defaults_out_name_)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,
               ": Could not find FeatureSet in descriptor pool.  Please make sure descriptor.proto is in your import path"
               ,0x69);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    bVar3 = false;
  }
  else {
    local_118.
    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_118.
    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_118.
    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    DescriptorPool::FindAllExtensions(pool,extendee,&local_118);
    uVar9 = 0x3e6;
    if (this->edition_defaults_minimum_ != EDITION_UNKNOWN) {
      uVar9 = (ulong)this->edition_defaults_minimum_;
    }
    minimum_edition = EDITION_2023;
    if (this->edition_defaults_maximum_ != EDITION_UNKNOWN) {
      minimum_edition = this->edition_defaults_maximum_;
    }
    extensions_00.ptr_ =
         (pointer)((long)local_118.
                         super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_118.
                         super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 3);
    extensions_00.len_ = uVar9;
    FeatureResolver::CompileDefaults
              ((StatusOr<google::protobuf::FeatureSetDefaults> *)&local_a8.status_,
               (FeatureResolver *)extendee,
               (Descriptor *)
               local_118.
               super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
               ._M_impl.super__Vector_impl_data._M_start,extensions_00,minimum_edition,
               in_stack_fffffffffffffed8);
    if (local_a8 ==
        (anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::FeatureSetDefaults>_1)0x1) {
      do {
        file_descriptor = open((this->edition_defaults_out_name_)._M_dataplus._M_p,0x241,0x1b6);
        if (-1 < file_descriptor) {
          io::FileOutputStream::FileOutputStream(&local_68,file_descriptor,-1);
          local_f8.impl_.is_serialization_deterministic_ =
               (bool)(io::CodedOutputStream::default_serialization_deterministic_ & 1);
          puVar1 = local_f8.impl_.buffer_;
          local_f8.impl_.had_error_ = false;
          local_f8.impl_.aliasing_enabled_ = false;
          local_f8.impl_.skip_check_consistency = false;
          local_f8.impl_.end_ = puVar1;
          local_f8.impl_.buffer_end_ = puVar1;
          local_f8.impl_.stream_ = (ZeroCopyOutputStream *)&local_68;
          local_f8.cur_ = puVar1;
          local_f8.start_count_ =
               io::CopyingOutputStreamAdaptor::ByteCount(&local_68.super_CopyingOutputStreamAdaptor)
          ;
          bVar3 = io::CopyingOutputStreamAdaptor::Next
                            (&local_68.super_CopyingOutputStreamAdaptor,&local_100,(int *)&local_11c
                            );
          if (bVar3 && 0 < (int)local_11c) {
            ppZVar2 = &local_100[-1].stream_;
            if ((int)local_11c < 0x11) {
              ppZVar2 = (ZeroCopyOutputStream **)puVar1;
            }
            local_f8.impl_.end_ = (uint8_t *)((long)ppZVar2 + (ulong)local_11c);
            local_f8.impl_.buffer_end_ = (uint8_t *)local_100;
            local_f8.cur_ = puVar1;
            if (0x10 < (int)local_11c) {
              local_f8.impl_.buffer_end_ = (uint8_t *)(EpsCopyOutputStream *)0x0;
              local_f8.cur_ = (uint8_t *)local_100;
            }
          }
          local_f8.impl_.is_serialization_deterministic_ = true;
          if (local_a8 !=
              (anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::FeatureSetDefaults>_1)0x1)
          {
            absl::lts_20250127::internal_statusor::Helper::Crash(&local_a8.status_);
          }
          bVar3 = MessageLite::SerializeToCodedStream(local_a0,&local_f8);
          if (bVar3) {
            io::CodedOutputStream::~CodedOutputStream(&local_f8);
LAB_001851e6:
            bVar4 = io::FileOutputStream::Close(&local_68);
            bVar3 = true;
            if (!bVar4) {
              poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)&std::cerr,
                                  (this->edition_defaults_out_name_)._M_dataplus._M_p,
                                  (this->edition_defaults_out_name_)._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar6,": ",2);
              pcVar7 = strerror(local_68.copying_output_.errno_);
              if (pcVar7 == (char *)0x0) {
                std::ios::clear((int)poVar6 + (int)*(undefined8 *)(*(long *)poVar6 + -0x18));
              }
              else {
                sVar8 = strlen(pcVar7);
                std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar7,sVar8);
              }
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
              std::ostream::put((char)poVar6);
              std::ostream::flush();
              goto LAB_0018529b;
            }
          }
          else {
            poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&std::cerr,
                                (this->edition_defaults_out_name_)._M_dataplus._M_p,
                                (this->edition_defaults_out_name_)._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6,": ",2);
            pcVar7 = strerror(local_68.copying_output_.errno_);
            if (pcVar7 == (char *)0x0) {
              std::ios::clear((int)poVar6 + (int)*(undefined8 *)(*(long *)poVar6 + -0x18));
            }
            else {
              sVar8 = strlen(pcVar7);
              std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar7,sVar8);
            }
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
            std::ostream::put((char)poVar6);
            std::ostream::flush();
            io::FileOutputStream::Close(&local_68);
            io::CodedOutputStream::~CodedOutputStream(&local_f8);
            if (bVar3) goto LAB_001851e6;
LAB_0018529b:
            bVar3 = false;
          }
          io::FileOutputStream::~FileOutputStream(&local_68);
          goto LAB_001852aa;
        }
        piVar5 = __errno_location();
      } while (*piVar5 == 4);
      perror((this->edition_defaults_out_name_)._M_dataplus._M_p);
    }
    else {
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,(this->edition_defaults_out_name_)._M_dataplus._M_p,
                          (this->edition_defaults_out_name_)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,": ",2);
      if (((ulong)local_a8 & 1) == 0) {
        pcVar7 = *(char **)((long)local_a8 + 8);
        uVar9 = *(ulong *)((long)local_a8 + 0x10);
      }
      else {
        uVar9 = (ulong)((uint)(((long)local_a8 << 0x3e) >> 0x3f) & 0x1b);
        pcVar7 = (char *)(((long)local_a8 << 0x3e) >> 0x3f & 0x52c780);
      }
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar7,uVar9);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
      std::ostream::put((char)poVar6);
      std::ostream::flush();
    }
    bVar3 = false;
LAB_001852aa:
    absl::lts_20250127::internal_statusor::StatusOrData<google::protobuf::FeatureSetDefaults>::
    ~StatusOrData((StatusOrData<google::protobuf::FeatureSetDefaults> *)&local_a8.status_);
    if ((Descriptor *)
        local_118.
        super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
        ._M_impl.super__Vector_impl_data._M_start != (Descriptor *)0x0) {
      operator_delete(local_118.
                      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_118.
                            super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_118.
                            super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  return bVar3;
}

Assistant:

bool CommandLineInterface::WriteEditionDefaults(const DescriptorPool& pool) {
  const Descriptor* feature_set;
  if (opensource_runtime_) {
    feature_set = pool.FindMessageTypeByName("google.protobuf.FeatureSet");
  } else {
    feature_set = pool.FindMessageTypeByName("google.protobuf.FeatureSet");
  }
  if (feature_set == nullptr) {
    std::cerr << edition_defaults_out_name_
              << ": Could not find FeatureSet in descriptor pool.  Please make "
                 "sure descriptor.proto is in your import path"
              << std::endl;
    return false;
  }
  std::vector<const FieldDescriptor*> extensions;
  pool.FindAllExtensions(feature_set, &extensions);

  Edition minimum = ProtocMinimumEdition();
  if (edition_defaults_minimum_ != EDITION_UNKNOWN) {
    minimum = edition_defaults_minimum_;
  }
  Edition maximum = ProtocMaximumEdition();
  if (edition_defaults_maximum_ != EDITION_UNKNOWN) {
    maximum = edition_defaults_maximum_;
  }

  absl::StatusOr<FeatureSetDefaults> defaults =
      FeatureResolver::CompileDefaults(feature_set, extensions, minimum,
                                       maximum);
  if (!defaults.ok()) {
    std::cerr << edition_defaults_out_name_ << ": "
              << defaults.status().message() << std::endl;
    return false;
  }

  int fd;
  do {
    fd = open(edition_defaults_out_name_.c_str(),
              O_WRONLY | O_CREAT | O_TRUNC | O_BINARY, 0666);
  } while (fd < 0 && errno == EINTR);

  if (fd < 0) {
    perror(edition_defaults_out_name_.c_str());
    return false;
  }

  io::FileOutputStream out(fd);

  {
    io::CodedOutputStream coded_out(&out);
    // Determinism is useful here because build outputs are sometimes checked
    // into version control.
    coded_out.SetSerializationDeterministic(true);
    if (!defaults->SerializeToCodedStream(&coded_out)) {
      std::cerr << edition_defaults_out_name_ << ": "
                << strerror(out.GetErrno()) << std::endl;
      out.Close();
      return false;
    }
  }

  if (!out.Close()) {
    std::cerr << edition_defaults_out_name_ << ": " << strerror(out.GetErrno())
              << std::endl;
    return false;
  }

  return true;
}